

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeForJS.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeForJSPass::rewritePopcntEqualOne(OptimizeForJSPass *this,Expression *expr)

{
  undefined4 uVar1;
  UnaryOp op;
  BinaryOp op_00;
  BinaryOp op_01;
  BasicType BVar2;
  Unary *pUVar3;
  LocalGet *left;
  LocalGet *left_00;
  Const *right;
  Binary *pBVar4;
  Unary *right_00;
  Type TVar5;
  Literal local_88;
  undefined1 local_70 [8];
  Localizer temp;
  Type type;
  Builder local_38;
  Builder builder;
  
  TVar5.id = (expr->type).id;
  temp.expr = (Expression *)TVar5.id;
  op = Abstract::getUnary(TVar5,EqZ);
  Localizer::Localizer
            ((Localizer *)local_70,expr,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
             .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
             currFunction,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
             .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
             currModule);
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
       ).super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
       super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
       currModule;
  pUVar3 = Builder::makeUnary(&local_38,op,(Expression *)temp._0_8_);
  pUVar3 = Builder::makeUnary(&local_38,EqZInt32,(Expression *)pUVar3);
  op_00 = Abstract::getBinary(TVar5,And);
  uVar1 = local_70._0_4_;
  left = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  left->index = uVar1;
  (left->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar5.id;
  op_01 = Abstract::getBinary(TVar5,Sub);
  left_00 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  left_00->index = local_70._0_4_;
  (left_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar5.id;
  BVar2 = wasm::Type::getBasic((Type *)&temp.expr);
  TVar5.id._4_4_ = 0;
  TVar5.id._0_4_ = BVar2;
  Literal::makeOne(&local_88,TVar5);
  right = Builder::makeConst(&local_38,&local_88);
  pBVar4 = Builder::makeBinary(&local_38,op_01,(Expression *)left_00,(Expression *)right);
  pBVar4 = Builder::makeBinary(&local_38,op_00,(Expression *)left,(Expression *)pBVar4);
  right_00 = Builder::makeUnary(&local_38,op,(Expression *)pBVar4);
  pBVar4 = Builder::makeBinary(&local_38,AndInt32,(Expression *)pUVar3,(Expression *)right_00);
  Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
              ).
              super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
              .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>,
             (Expression *)pBVar4);
  Literal::~Literal(&local_88);
  return;
}

Assistant:

void rewritePopcntEqualOne(Expression* expr) {
    // popcnt(x) == 1   ==>   !!x & !(x & (x - 1))
    using namespace Abstract;

    Type type = expr->type;

    UnaryOp eqzOp = getUnary(type, EqZ);
    Localizer temp(expr, getFunction(), getModule());
    Builder builder(*getModule());

    replaceCurrent(builder.makeBinary(
      AndInt32,
      builder.makeUnary(EqZInt32, builder.makeUnary(eqzOp, temp.expr)),
      builder.makeUnary(
        eqzOp,
        builder.makeBinary(
          getBinary(type, And),
          builder.makeLocalGet(temp.index, type),
          builder.makeBinary(
            getBinary(type, Sub),
            builder.makeLocalGet(temp.index, type),
            builder.makeConst(Literal::makeOne(type.getBasic())))))));
  }